

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<BlockStatementAstNode>_> * __thiscall
Parser::parseBlockStatement
          (optional<std::shared_ptr<BlockStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<StatementAstNode> *__x;
  TokenType type;
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  local_130;
  undefined1 local_118 [8];
  optional<std::shared_ptr<StatementAstNode>_> statement;
  string local_f8 [32];
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  string local_b0 [32];
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<Token> identifier;
  bool error;
  Parser *this_local;
  
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a left curly bracket",
             (allocator<char> *)
             ((long)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  type = (TokenType)this;
  expect((Parser *)local_30,type,(bool *)0x2,
         (string *)
         ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
          *)(local_80 + 0x10));
  do {
    skipWhiteSpace(this);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_80);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_80);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_80);
    if (TVar1 == EndOfFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_b0,"Expected a right curly bracket to close block",
                 (allocator<char> *)(local_c8 + 0x17));
      expect((Parser *)local_90,type,(bool *)0x3,
             (string *)
             ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x17));
      std::optional<std::shared_ptr<BlockStatementAstNode>_>::optional(__return_storage_ptr__);
LAB_0010ea80:
      local_c8._16_4_ = 1;
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 *)(local_80 + 0x10));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
      return __return_storage_ptr__;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_c8);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_c8);
    if (TVar1 == RightCurly) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f8,"Expected a right curly bracket to close block",
                 (allocator<char> *)
                 &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
      expect((Parser *)local_d8,type,(bool *)0x3,
             (string *)
             ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
      if ((identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
          & 1) == 0) {
        std::
        make_shared<BlockStatementAstNode,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
                  (&local_130);
        std::optional<std::shared_ptr<BlockStatementAstNode>_>::
        optional<std::shared_ptr<BlockStatementAstNode>,_true>
                  (__return_storage_ptr__,(shared_ptr<BlockStatementAstNode> *)&local_130);
        std::shared_ptr<BlockStatementAstNode>::~shared_ptr
                  ((shared_ptr<BlockStatementAstNode> *)&local_130);
      }
      else {
        std::optional<std::shared_ptr<BlockStatementAstNode>_>::optional(__return_storage_ptr__);
      }
      goto LAB_0010ea80;
    }
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_118,this);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_118);
    if (bVar2) {
      __x = std::optional<std::shared_ptr<StatementAstNode>_>::value
                      ((optional<std::shared_ptr<StatementAstNode>_> *)local_118);
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)(local_80 + 0x10),__x);
    }
    else {
      identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
    }
    std::optional<std::shared_ptr<StatementAstNode>_>::~optional
              ((optional<std::shared_ptr<StatementAstNode>_> *)local_118);
  } while( true );
}

Assistant:

const std::optional<std::shared_ptr<BlockStatementAstNode>>
Parser::parseBlockStatement() noexcept {
  bool error = false;

  auto identifier = this->expect(TokenType::LeftCurly, error, "Expected a left curly bracket");

  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error, "Expected a right curly bracket to close block");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error, "Expected a right curly bracket to close block");
      break;
    }

    auto statement = this->parseStatement();

    if (!statement) {
      error = true;

    } else {
      statements.push_back(statement.value());
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<BlockStatementAstNode>(statements);
}